

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O1

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::WindowStateChangedEvent,QWindow*,QFlags<Qt::WindowState>,QFlags<Qt::WindowState>>
               (QWindow *args,QFlags<Qt::WindowState> args_1,QFlags<Qt::WindowState> args_2)

{
  bool bVar1;
  WindowSystemEvent *e;
  _func_int **pp_Var2;
  long *plVar3;
  
  if (QWindowSystemInterfacePrivate::synchronousWindowSystemEvents) {
    bVar1 = QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
            handleEvent<QWindowSystemInterfacePrivate::WindowStateChangedEvent,QWindow*,QFlags<Qt::WindowState>,QFlags<Qt::WindowState>>
                      (args,args_1,args_2);
    return bVar1;
  }
  e = (WindowSystemEvent *)operator_new(0x30);
  e->type = WindowStateChanged;
  e->flags = 0;
  e->eventAccepted = true;
  e->_vptr_WindowSystemEvent = (_func_int **)&PTR__WindowStateChangedEvent_007e9e30;
  if (args == (QWindow *)0x0) {
    pp_Var2 = (_func_int **)0x0;
  }
  else {
    pp_Var2 = (_func_int **)QtSharedPointer::ExternalRefCountData::getAndRef(&args->super_QObject);
  }
  e[1]._vptr_WindowSystemEvent = pp_Var2;
  *(QWindow **)&e[1].type = args;
  *(QFlagsStorageHelper<Qt::WindowState,_4> *)&e[1].eventAccepted =
       args_1.super_QFlagsStorageHelper<Qt::WindowState,_4>.super_QFlagsStorage<Qt::WindowState>.i;
  *(QFlagsStorageHelper<Qt::WindowState,_4> *)&e[1].field_0x14 =
       args_2.super_QFlagsStorageHelper<Qt::WindowState,_4>.super_QFlagsStorage<Qt::WindowState>.i;
  QWindowSystemInterfacePrivate::WindowSystemEventList::append
            (&QWindowSystemInterfacePrivate::windowSystemEventQueue,e);
  if (QCoreApplication::self == 0) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar3 = *(long **)(*(long *)(*(long *)(QCoreApplication::self + 8) + 0x58) + 0x60);
  }
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 0xa0))();
  }
  return true;
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::handleEvent(Args ...args)
{
    return QWindowSystemInterfacePrivate::synchronousWindowSystemEvents
        ? QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent<EventType>(args...)
        : QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
}